

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O0

void __thiscall ctemplate::IndentedWriter::IndentLine(IndentedWriter *this)

{
  int iVar1;
  string *psVar2;
  allocator local_51;
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  IndentedWriter *local_10;
  IndentedWriter *this_local;
  
  local_10 = this;
  if (this->line_state_ == AT_BEGINNING) {
    psVar2 = (string *)this->out_;
    iVar1 = this->current_indentation_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(long)iVar1,' ',&local_51);
    std::operator+(local_30,(char *)local_50);
    std::__cxx11::string::append(psVar2);
    std::__cxx11::string::~string((string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    return;
  }
  __assert_fail("line_state_ == AT_BEGINNING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                ,0x74,"void ctemplate::IndentedWriter::IndentLine()");
}

Assistant:

void IndentLine() {
    assert(line_state_ == AT_BEGINNING);
    out_->append(string(current_indentation_, ' ') +
                 (current_indentation_ ? " " : ""));
  }